

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

ForStatement * __thiscall SQASTReader::readForStatement(SQASTReader *this)

{
  Node *args;
  Expr *args_1;
  Expr *args_2;
  Statement *args_3;
  ForStatement *pFVar1;
  
  args = readNullable(this);
  args_1 = readNullableExpression(this);
  args_2 = readNullableExpression(this);
  args_3 = readNullableStatement(this);
  pFVar1 = newNode<SQCompilation::ForStatement,SQCompilation::Node*,SQCompilation::Expr*,SQCompilation::Expr*,SQCompilation::Statement*>
                     (this,args,args_1,args_2,args_3);
  return pFVar1;
}

Assistant:

ForStatement *SQASTReader::readForStatement() {
  Node *init = readNullable();
  Expr *condition = readNullableExpression();
  Expr *modifier = readNullableExpression();

  Statement *body = readNullableStatement();

  return newNode<ForStatement>(init, condition, modifier, body);
}